

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O2

optional<pbrt::SampledLight> * __thiscall
pbrt::BVHLightSampler::Sample
          (optional<pbrt::SampledLight> *__return_storage_ptr__,BVHLightSampler *this,
          LightSampleContext *ctx,Float u)

{
  Bounds3f *allb;
  LightBVHNode *pLVar1;
  size_t sVar2;
  size_t sVar3;
  anon_struct_8_0_00000001_for___align aVar4;
  LightBVHNode *pLVar5;
  float fVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Float *in_R8;
  ulong uVar12;
  long lVar13;
  Float FVar14;
  undefined1 auVar15 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar17 [56];
  undefined1 in_ZMM1 [64];
  float fVar18;
  Point3f PVar19;
  Point3f p;
  Point3f p_00;
  Normal3f n;
  Normal3f n_00;
  Normal3f n_01;
  span<const_float> weights;
  Float nodePDF;
  Float ci [2];
  LightBVHNode node;
  Float local_bc;
  optional<pbrt::SampledLight> *local_b8;
  float local_b0;
  float local_ac;
  float local_a8;
  Float local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  CompactLightBounds local_80;
  undefined8 uStack_68;
  undefined1 auVar16 [64];
  
  auVar17 = in_register_00001204._4_56_;
  sVar2 = (this->nodes).nStored;
  sVar3 = (this->infiniteLights).nStored;
  auVar15 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,sVar3);
  auVar7 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,(sVar3 + 1) - (ulong)(sVar2 == 0));
  fVar18 = auVar15._0_4_;
  local_b0 = fVar18 / auVar7._0_4_;
  if (u < local_b0) {
    iVar10 = (int)sVar3 + -1;
    auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(local_b0 * u)));
    iVar11 = (int)(auVar15._0_4_ * fVar18);
    if (iVar11 <= iVar10) {
      iVar10 = iVar11;
    }
    aVar4 = (anon_struct_8_0_00000001_for___align)
            (this->infiniteLights).ptr[iVar10].
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = aVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = local_b0 / fVar18;
    return __return_storage_ptr__;
  }
  local_b8 = __return_storage_ptr__;
  if (sVar2 == 0) {
LAB_003e911d:
    *(undefined8 *)&local_b8->set = 0;
    (local_b8->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&local_b8->optionalValue + 8) = 0;
  }
  else {
    PVar19 = LightSampleContext::p(ctx);
    auVar16._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar17;
    local_90 = auVar16._0_16_;
    local_a0._0_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
    local_a0._4_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
    allb = &this->allLightBounds;
    uVar12 = 0;
    uStack_98 = 0;
    fVar18 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar6 = 1.0 - local_b0;
    auVar15._0_4_ = (u - local_b0) / fVar6;
    auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar15);
    local_bc = auVar15._0_4_;
    while( true ) {
      auVar15 = local_90;
      pLVar5 = (this->nodes).ptr;
      pLVar1 = pLVar5 + uVar12;
      local_80.w = (pLVar1->lightBounds).w;
      local_80.phi = (pLVar1->lightBounds).phi;
      local_80.field_2 = (pLVar1->lightBounds).field_2;
      local_80.qb[0][0] = *(uint16_t *)((long)((pLVar1->lightBounds).qb + 0) + 0);
      local_80.qb[0][1] = *(uint16_t *)((long)((pLVar1->lightBounds).qb + 0) + 2);
      local_80.qb._4_8_ = *(undefined8 *)((pLVar1->lightBounds).qb[0] + 2);
      uStack_68 = *(undefined8 *)&pLVar1->field_1;
      uVar9 = (uint)uStack_68;
      lVar13 = (long)(int)(uint)uStack_68;
      local_90 = auVar15;
      if (lVar13 < 0) break;
      PVar19.super_Tuple3<pbrt::Point3,_float>.x = (float)local_90._0_4_;
      PVar19.super_Tuple3<pbrt::Point3,_float>.y = (float)local_90._4_4_;
      n.super_Tuple3<pbrt::Normal3,_float>.z = fVar18;
      n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_a0;
      n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_a0._4_4_;
      local_a8 = CompactLightBounds::Importance(&pLVar5[uVar12 + 1].lightBounds,PVar19,n,allb);
      auVar15 = local_90;
      p.super_Tuple3<pbrt::Point3,_float>.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
      p.super_Tuple3<pbrt::Point3,_float>.x = (float)local_90._0_4_;
      p.super_Tuple3<pbrt::Point3,_float>.y = (float)local_90._4_4_;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar18;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_a0;
      n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_a0._4_4_;
      local_90 = auVar15;
      local_a4 = CompactLightBounds::Importance(&pLVar5[lVar13].lightBounds,p,n_00,allb);
      if (((local_a4 == 0.0) && (local_a8 == 0.0)) && (!NAN(local_a8))) goto LAB_003e911d;
      weights.n = (size_t)&local_ac;
      weights.ptr = (float *)0x2;
      iVar10 = SampleDiscrete((pbrt *)&local_a8,weights,local_bc,&local_bc,in_R8);
      fVar6 = fVar6 * local_ac;
      uVar8 = (int)uVar12 + 1;
      if (iVar10 != 0) {
        uVar8 = uVar9;
      }
      uVar12 = (ulong)uVar8;
    }
    if ((int)uVar12 < 1) {
      p_00.super_Tuple3<pbrt::Point3,_float>.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
      p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)local_90._0_4_;
      p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)local_90._4_4_;
      n_01.super_Tuple3<pbrt::Normal3,_float>.z = fVar18;
      n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_a0;
      n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_a0._4_4_;
      FVar14 = CompactLightBounds::Importance(&local_80,p_00,n_01,allb);
      if (FVar14 <= 0.0) goto LAB_003e911d;
    }
    aVar4 = (anon_struct_8_0_00000001_for___align)
            (this->lights).ptr[(uint)uStack_68 & 0x7fffffff].
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    local_b8->set = true;
    (local_b8->optionalValue).__align = aVar4;
    *(float *)((long)&local_b8->optionalValue + 8) = fVar6;
  }
  return local_b8;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<SampledLight> Sample(const LightSampleContext &ctx, Float u) const {
        // Compute infinite light sampling probability _pInfinite_
        Float pInfinite = Float(infiniteLights.size()) /
                          Float(infiniteLights.size() + (!nodes.empty() ? 1 : 0));

        if (u < pInfinite) {
            // Sample infinite lights with uniform probability
            u = std::min<Float>(u * pInfinite, OneMinusEpsilon);
            int index =
                std::min<int>(u * infiniteLights.size(), infiniteLights.size() - 1);
            Float pdf = pInfinite * 1.f / infiniteLights.size();
            return SampledLight{infiniteLights[index], pdf};

        } else {
            // Traverse light BVH to sample light
            if (nodes.empty())
                return {};
            // Declare common variables for light BVH traversal
            Point3f p = ctx.p();
            Normal3f n = ctx.ns;
            u = std::min<Float>((u - pInfinite) / (1 - pInfinite), OneMinusEpsilon);
            int nodeIndex = 0;
            Float pdf = (1 - pInfinite);

            while (true) {
                // Process light BVH node for light sampling
                LightBVHNode node = nodes[nodeIndex];
                if (!node.isLeaf) {
                    // Compute light BVH child node importances
                    const LightBVHNode *children[2] = {&nodes[nodeIndex + 1],
                                                       &nodes[node.childOrLightIndex]};
                    Float ci[2] = {
                        children[0]->lightBounds.Importance(p, n, allLightBounds),
                        children[1]->lightBounds.Importance(p, n, allLightBounds)};
                    if (ci[0] == 0 && ci[1] == 0)
                        return {};

                    // Randomly sample light BVH child node
                    Float nodePDF;
                    int child = SampleDiscrete(ci, u, &nodePDF, &u);
                    pdf *= nodePDF;
                    nodeIndex = (child == 0) ? (nodeIndex + 1) : node.childOrLightIndex;

                } else {
                    // Confirm light has non-zero importance before returning light sample
                    if (nodeIndex > 0)
                        DCHECK_GT(node.lightBounds.Importance(p, n, allLightBounds), 0);
                    if (nodeIndex > 0 ||
                        node.lightBounds.Importance(p, n, allLightBounds) > 0)
                        return SampledLight{lights[node.childOrLightIndex], pdf};
                    return {};
                }
            }
        }
    }